

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_set_timeouts(tftp_state_data_t *state)

{
  tftp_state_t tVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uStack_20;
  
  tVar1 = state->state;
  time(&state->start_time);
  lVar6 = Curl_timeleft(state->conn->data,(timeval *)0x0,tVar1 == TFTP_STATE_START);
  if (lVar6 < 0) {
    Curl_failf(state->conn->data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if (tVar1 == TFTP_STATE_START) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lVar6 + 500;
    uVar7 = SUB168(auVar2 / ZEXT816(1000),0);
    lVar8 = state->start_time;
    lVar6 = lVar8 + uVar7;
    state->max_time = lVar6;
    iVar4 = SUB164(auVar2 / ZEXT816(1000),0);
    uStack_20 = (ulong)(uint)(iVar4 / 5);
    if (iVar4 < 5) {
      uStack_20 = 1;
    }
    state->retry_max = (int)uStack_20;
  }
  else {
    if (lVar6 == 0) {
      uVar7 = 0xe10;
    }
    else {
      uVar7 = (lVar6 + 500U) / 1000;
    }
    lVar8 = state->start_time;
    lVar6 = lVar8 + uVar7;
    state->max_time = lVar6;
    uVar3 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / 5;
    uStack_20 = uVar3 & 0xffffffff;
    state->retry_max = (int)uVar3;
  }
  if ((int)(uint)uStack_20 < 3) {
    uStack_20 = 3;
  }
  else {
    if ((uint)uStack_20 < 0x33) goto LAB_00135d05;
    uStack_20 = 0x32;
  }
  state->retry_max = (int)uStack_20;
LAB_00135d05:
  iVar5 = (int)(uVar7 / uStack_20);
  iVar4 = 1;
  if (1 < iVar5) {
    iVar4 = iVar5;
  }
  state->retry_time = iVar4;
  Curl_infof(state->conn->data,"set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
             (ulong)state->state,lVar6 - lVar8);
  time(&state->rx_time);
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_set_timeouts(tftp_state_data_t *state)
{
  time_t maxtime, timeout;
  long timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  time(&state->start_time);

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->conn->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->conn->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(start) {

    maxtime = (time_t)(timeout_ms + 500) / 1000;
    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average restart after 5 seconds */
    state->retry_max = (int)timeout/5;

    if(state->retry_max < 1)
      /* avoid division by zero below */
      state->retry_max = 1;

    /* Compute the re-start interval to suit the timeout */
    state->retry_time = (int)timeout/state->retry_max;
    if(state->retry_time<1)
      state->retry_time=1;

  }
  else {
    if(timeout_ms > 0)
      maxtime = (time_t)(timeout_ms + 500) / 1000;
    else
      maxtime = 3600;

    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average reposting an ACK after 5 seconds */
    state->retry_max = (int)timeout/5;
  }
  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max=3;

  if(state->retry_max>50)
    state->retry_max=50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time=1;

  infof(state->conn->data,
        "set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
        (int)state->state, (long)(state->max_time-state->start_time),
        state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}